

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econftool.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  __uid_t _Var2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  passwd *ppVar6;
  int local_54;
  int ret;
  passwd *pw;
  int local_40;
  int index;
  int nonopts;
  int opt;
  char *delimiters;
  char *comment;
  _Bool use_homedir;
  _Bool is_root;
  char *pcStack_20;
  _Bool is_dropin_file;
  char *home_dir;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  pcStack_20 = (char *)0x0;
  comment._7_1_ = 1;
  comment._6_1_ = 0;
  comment._5_1_ = 0;
  delimiters = "#";
  _nonopts = "=";
  pw._4_4_ = 0;
  home_dir = (char *)argv;
  argv_local._0_4_ = argc;
  root_dir = strdup("/etc");
  usr_root_dir = strdup("/usr/etc");
  conf_dir = strdup("");
  conf_basename = strdup("");
  while (index = getopt_long((int)argv_local,home_dir,"hfyuc:d:",main::longopts,(long)&pw + 4),
        index != -1) {
    switch(index) {
    case 0x3f:
    default:
      fprintf(_stderr,"Try \'%s --help\' for more information.\n",utilname);
      exit(1);
    case 99:
      delimiters = _optarg;
      break;
    case 100:
      _nonopts = _optarg;
      break;
    case 0x66:
      free(conf_dir);
      iVar1 = asprintf(&conf_dir,"%s","/etc");
      if (iVar1 < 0) {
        fprintf(_stderr,"Out of memory!\n");
        exit(1);
      }
      change_root_dir(&conf_dir);
      comment._7_1_ = 0;
      break;
    case 0x68:
      usage();
      return 0;
    case 0x75:
      comment._5_1_ = 1;
      break;
    case 0x79:
      non_interactive = true;
    }
  }
  local_40 = (int)argv_local - _optind;
  if ((int)argv_local < 2) {
    usage();
    argv_local._4_4_ = 1;
  }
  else if (((int)argv_local < 3) || (local_40 < 2)) {
    fprintf(_stderr,"Invalid number of Arguments\n\n");
    usage();
    argv_local._4_4_ = 1;
  }
  else {
    iVar1 = strcmp(_nonopts,"spaces");
    if (iVar1 == 0) {
      _nonopts = " \t\f\n\r\v";
    }
    else {
      _nonopts = replace_str(_nonopts,"\\t","\t");
      _nonopts = replace_str(_nonopts,"\\f","\f");
      _nonopts = replace_str(_nonopts,"\\n","\n");
      _nonopts = replace_str(_nonopts,"\\r","\r");
      _nonopts = replace_str(_nonopts,"\\v","\v");
    }
    _Var2 = getuid();
    comment._6_1_ = _Var2 == 0;
    if (**(char **)(home_dir + (long)(_optind + 1) * 8) != '/') {
      conf_suffix = strrchr(*(char **)(home_dir + (long)(_optind + 1) * 8),0x2e);
      if (conf_suffix == (char *)0x0) {
        fprintf(_stderr,"Currently only works with a dot in the filename and a suffix!\n\n");
        usage();
        exit(1);
      }
      free(conf_basename);
      pcVar5 = *(char **)(home_dir + (long)(_optind + 1) * 8);
      sVar3 = strlen(*(char **)(home_dir + (long)(_optind + 1) * 8));
      sVar4 = strlen(conf_suffix);
      conf_basename = strndup(pcVar5,sVar3 - sVar4);
      if (conf_basename == (char *)0x0) {
        fprintf(_stderr,"Out of memory!\n");
        return 1;
      }
    }
    conf_filename = strdup(*(char **)(home_dir + (long)(_optind + 1) * 8));
    if (conf_filename == (char *)0x0) {
      fprintf(_stderr,"Out of memory!\n");
      exit(1);
    }
    if ((comment._7_1_ & 1) != 0) {
      free(conf_dir);
      iVar1 = asprintf(&conf_dir,"/etc/%s.d",conf_filename);
      if (iVar1 < 0) {
        fprintf(_stderr,"Out of memory!\n");
        exit(1);
      }
      change_root_dir(&conf_dir);
    }
    free(conf_path);
    iVar1 = asprintf(&conf_path,"%s/%s",conf_dir,conf_filename);
    if (iVar1 < 0) {
      fprintf(_stderr,"Out of memory!\n");
      argv_local._4_4_ = 1;
    }
    else {
      pcVar5 = getenv("ECONFTOOL_ROOT");
      if (pcVar5 == (char *)0x0) {
        pcVar5 = getenv("HOME");
        if (pcVar5 == (char *)0x0) {
          _Var2 = getuid();
          ppVar6 = getpwuid(_Var2);
          if (ppVar6 != (passwd *)0x0) {
            free(pcStack_20);
            pcStack_20 = strdup(ppVar6->pw_dir);
            if (pcStack_20 == (char *)0x0) {
              fprintf(_stderr,"Out of memory!\n");
              return 1;
            }
          }
        }
        else {
          free(pcStack_20);
          pcVar5 = getenv("HOME");
          pcStack_20 = strdup(pcVar5);
          if (pcStack_20 == (char *)0x0) {
            fprintf(_stderr,"Out of memory!\n");
            return 1;
          }
        }
      }
      else {
        change_root_dir(&stack0xffffffffffffffe0);
      }
      pcVar5 = getenv("XDG_CONFIG_HOME");
      if (pcVar5 == (char *)0x0) {
        iVar1 = asprintf(&xdg_config_dir,"%s/.config",pcStack_20);
        if (iVar1 < 0) {
          fprintf(_stderr,"Out of memory!\n");
          exit(1);
        }
      }
      else {
        pcVar5 = getenv("XDG_CONFIG_HOME");
        xdg_config_dir = strdup(pcVar5);
        if (xdg_config_dir == (char *)0x0) {
          fprintf(_stderr,"Out of memory!\n");
          exit(1);
        }
      }
      free(pcStack_20);
      change_root_dir(&root_dir);
      change_root_dir(&usr_root_dir);
      iVar1 = strcmp(*(char **)(home_dir + (long)_optind * 8),"show");
      if (iVar1 == 0) {
        local_54 = econf_read(&main::key_file,_nonopts,delimiters,true);
      }
      else {
        iVar1 = strcmp(*(char **)(home_dir + (long)_optind * 8),"syntax");
        if (iVar1 == 0) {
          local_54 = econf_read(&main::key_file,_nonopts,delimiters,false);
        }
        else {
          iVar1 = strcmp(*(char **)(home_dir + (long)_optind * 8),"edit");
          if (iVar1 == 0) {
            if (((comment._6_1_ & 1) == 0) || ((comment._5_1_ & 1) != 0)) {
              free(conf_dir);
              conf_dir = strdup(xdg_config_dir);
              if (conf_dir == (char *)0x0) {
                fprintf(_stderr,"Out of memory!\n");
                exit(1);
              }
              change_root_dir(&conf_dir);
              free(conf_path);
              iVar1 = asprintf(&conf_path,"%s/%s",conf_dir,conf_filename);
              if (iVar1 < 0) {
                fprintf(_stderr,"Out of memory!\n");
                return 1;
              }
            }
            else if ((comment._7_1_ & 1) != 0) {
              free(conf_filename);
              conf_filename = strdup(main::dropin_filename);
              if (conf_filename == (char *)0x0) {
                fprintf(_stderr,"Out of memory!\n");
                exit(1);
              }
              free(conf_path);
              iVar1 = asprintf(&conf_path,"%s/%s",conf_dir,conf_filename);
              if (iVar1 < 0) {
                fprintf(_stderr,"Out of memory!\n");
                return 1;
              }
            }
            local_54 = econf_edit(&main::key_file,_nonopts,delimiters);
          }
          else {
            iVar1 = strcmp(*(char **)(home_dir + (long)_optind * 8),"revert");
            if (iVar1 == 0) {
              local_54 = econf_revert((_Bool)(comment._6_1_ & 1),(_Bool)(comment._5_1_ & 1));
            }
            else {
              iVar1 = strcmp(*(char **)(home_dir + (long)_optind * 8),"cat");
              if (iVar1 != 0) {
                fprintf(_stderr,"Unknown command!\n\n");
                usage();
                exit(1);
              }
              local_54 = econf_cat(_nonopts,delimiters);
            }
          }
        }
      }
      econf_freeFile(main::key_file);
      argv_local._4_4_ = local_54;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char *argv[])
{
    static const char *dropin_filename = "90_econftool.conf";
    static econf_file *key_file = NULL;
    char *home_dir = NULL; /* the path of the home directory */
    bool is_dropin_file = true;
    bool is_root = false;
    bool use_homedir = false;
    char *comment = "#";
    char *delimiters = "=";

    /* parse command line arguments. See getopt_long(3) */
    int opt, nonopts;

    int index = 0;
    static struct option longopts[] = {
    /*   name,     arguments,      flag, value */
        {"full",        no_argument,       0, 'f'},
        {"help",        no_argument,       0, 'h'},
        {"yes",         no_argument,       0, 'y'},
        {"use-home",    no_argument,       0, 'u'},
	{"comment",     required_argument, 0, 'c'},
	{"delimiters",  required_argument, 0, 'd'},
        {0,             0,                 0,  0 }
    };

    root_dir = strdup("/etc");
    usr_root_dir = strdup("/usr/etc");
    conf_dir = strdup("");
    conf_basename = strdup("");

    while ((opt = getopt_long(argc, argv, "hfyuc:d:", longopts, &index)) != -1) {
        switch(opt) {
        case 'f':
            /* overwrite path */
	    free(conf_dir);
            if (asprintf(&conf_dir, "%s", "/etc") < 0) {
		fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
            change_root_dir(&conf_dir);
            is_dropin_file = false;
            break;
        case 'h':
            usage();
            return EXIT_SUCCESS;
        case 'y':
            non_interactive = true;
            break;
        case 'u':
            use_homedir = true;
            break;
	case 'c':
	    comment = optarg;
	    break;
	case 'd':
	    delimiters = optarg;
	    break;
        case '?':
        default:
            fprintf(stderr, "Try '%s --help' for more information.\n", utilname);
            exit(EXIT_FAILURE);
            break;
        }
    }
    nonopts = argc - optind;

    /* only do something if we have an input */
    if (argc < 2) {
        usage();
        return EXIT_FAILURE;
    } else if (argc < 3 || nonopts < 2) {
        fprintf(stderr, "Invalid number of Arguments\n\n");
        usage();
        return EXIT_FAILURE;
    }

    /* translating delimiters */
    if ( strcmp(delimiters, "spaces") == 0 ) {
      delimiters = " \t\f\n\r\v";
    } else {
      delimiters = replace_str(delimiters, "\\t", "\t");
      delimiters = replace_str(delimiters, "\\f", "\f");
      delimiters = replace_str(delimiters, "\\n", "\n");
      delimiters = replace_str(delimiters, "\\r", "\r");
      delimiters = replace_str(delimiters, "\\v", "\v");
    }

    /**** initialization ****/
    /* basic write permission check */
    is_root = getuid() == 0;

    if ( argv[optind + 1][0] != '/') {
	/* it is not a single file only */

        /* get the position of the last dot in the filename to extract
         * the suffix from it.
         */
        conf_suffix = strrchr(argv[optind + 1], '.');
        if (conf_suffix == NULL) {
            fprintf(stderr, "Currently only works with a dot in the filename and a suffix!\n\n");
	    usage();
	    exit(1);
	} else {
            /* set filename to the proper argv argument */
            free(conf_basename);
	    conf_basename = strndup(argv[optind + 1], strlen(argv[optind + 1]) - strlen(conf_suffix));
	    if (conf_basename == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
	}
    }

    conf_filename = strdup(argv[optind + 1]);
    if (conf_filename == NULL) {
	fprintf(stderr, "Out of memory!\n");
	exit(EXIT_FAILURE);
    }

    if (is_dropin_file) {
        free(conf_dir);
        if (asprintf(&conf_dir, "/etc/%s.d", conf_filename) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
        change_root_dir(&conf_dir);
    }

    free(conf_path);
    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
	fprintf(stderr, "Out of memory!\n");
	return EXIT_FAILURE;
    }

    if (getenv("ECONFTOOL_ROOT") == NULL)
        if (getenv("HOME") != NULL) {
	    free(home_dir);
	    home_dir = strdup(getenv("HOME"));
	    if (home_dir == NULL) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
        } else {
            struct passwd *pw = getpwuid(getuid());
            if(pw) {
		free (home_dir);
		home_dir = strdup(pw->pw_dir);
		if (home_dir == NULL) {
		    fprintf(stderr, "Out of memory!\n");
		    return EXIT_FAILURE;
		}
	    }
        }
    else
        change_root_dir(&home_dir);

    if (getenv("XDG_CONFIG_HOME") == NULL) {
        /* if no XDG_CONFIG_HOME is specified take ~/.config as default */
        if (asprintf(&xdg_config_dir, "%s/.config", home_dir) < 0) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
    } else {
        xdg_config_dir = strdup(getenv("XDG_CONFIG_HOME"));
	if (xdg_config_dir == NULL) {
	    fprintf(stderr, "Out of memory!\n");
	    exit(EXIT_FAILURE);
        }
    }

    free(home_dir);

    /* Change Root dirs */
    change_root_dir(&root_dir);
    change_root_dir(&usr_root_dir);

    int ret = 0;
    if (strcmp(argv[optind], "show") == 0) {
      ret = econf_read(&key_file, delimiters, comment, true);
    } else if (strcmp(argv[optind], "syntax") == 0) {
      ret = econf_read(&key_file, delimiters, comment, false);
    } else if (strcmp(argv[optind], "edit") == 0) {
        if (!is_root || use_homedir) {
            /* adjust path to home directory of the user.*/
            free(conf_dir);
	    conf_dir = strdup(xdg_config_dir);
	    if (conf_dir == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
            change_root_dir(&conf_dir);
	    free(conf_path);
	    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
        } else if(is_dropin_file) {
	    free(conf_filename);
	    conf_filename = strdup(dropin_filename);
	    if (conf_filename == NULL) {
	        fprintf(stderr, "Out of memory!\n");
		exit(EXIT_FAILURE);
	    }
	    free(conf_path);
	    if (asprintf(&conf_path, "%s/%s", conf_dir, conf_filename) < 0) {
		fprintf(stderr, "Out of memory!\n");
		return EXIT_FAILURE;
	    }
	}

        ret = econf_edit(&key_file, delimiters, comment);
    } else if (strcmp(argv[optind], "revert") == 0) {
      ret = econf_revert(is_root, use_homedir);
    } else if (strcmp(argv[optind], "cat") == 0) {
	ret = econf_cat(delimiters, comment);
    } else {
        fprintf(stderr, "Unknown command!\n\n");
        usage();
        exit(EXIT_FAILURE);
    }

    /* cleanup */
    econf_free(key_file);
    return ret;
}